

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O2

Int __thiscall
ipx::Crossover::PrimalRatioTest
          (Crossover *this,Vector *xbasic,IndexedVector *ftran,Vector *lbbasic,Vector *ubbasic,
          double step,double feastol,bool *block_at_lb)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  Int ii;
  Int ii_1;
  ulong uVar6;
  Int pblock;
  anon_class_56_7_6d025434 update_max;
  anon_class_56_7_2fdfb747 update_step;
  double max_pivot;
  Int local_d4;
  Vector *local_d0;
  Vector *local_c8;
  bool *local_c0;
  double local_b8;
  anon_class_56_7_6d025434 local_b0;
  anon_class_56_7_2fdfb747 local_78;
  double local_40;
  double local_38;
  
  local_78.step = &local_b8;
  local_78.feastol = &local_38;
  local_78.block_at_lb = &local_c0;
  local_78.pblock = &local_d4;
  local_d4 = -1;
  *block_at_lb = true;
  local_d0 = lbbasic;
  local_c8 = ubbasic;
  local_c0 = block_at_lb;
  local_b8 = step;
  local_78.xbasic = xbasic;
  local_78.lbbasic = lbbasic;
  local_78.ubbasic = ubbasic;
  local_38 = feastol;
  bVar4 = IndexedVector::sparse(ftran);
  if (bVar4) {
    piVar3 = (ftran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(uint)ftran->nnz_;
    if (ftran->nnz_ < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = piVar3[uVar6];
      PrimalRatioTest::anon_class_56_7_2fdfb747::operator()
                (&local_78,iVar1,(ftran->elements_)._M_data[iVar1]);
    }
  }
  else {
    uVar2 = (uint)(ftran->elements_)._M_size;
    uVar6 = 0;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      PrimalRatioTest::anon_class_56_7_2fdfb747::operator()
                (&local_78,(Int)uVar6,(ftran->elements_)._M_data[uVar6]);
    }
  }
  if (-1 < local_d4) {
    local_d4 = -1;
    local_b0.max_pivot = &local_40;
    local_40 = 1e-05;
    local_b0.step = &local_b8;
    local_b0.lbbasic = local_d0;
    local_b0.pblock = &local_d4;
    local_b0.block_at_lb = &local_c0;
    local_b0.ubbasic = local_c8;
    local_b0.xbasic = xbasic;
    bVar4 = IndexedVector::sparse(ftran);
    if (bVar4) {
      piVar3 = (ftran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      uVar5 = (ulong)(uint)ftran->nnz_;
      if (ftran->nnz_ < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar1 = piVar3[uVar6];
        PrimalRatioTest::anon_class_56_7_6d025434::operator()
                  (&local_b0,iVar1,(ftran->elements_)._M_data[iVar1]);
      }
    }
    else {
      uVar2 = (uint)(ftran->elements_)._M_size;
      uVar6 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        PrimalRatioTest::anon_class_56_7_6d025434::operator()
                  (&local_b0,(Int)uVar6,(ftran->elements_)._M_data[uVar6]);
      }
    }
  }
  return local_d4;
}

Assistant:

Int Crossover::PrimalRatioTest(const Vector& xbasic, const IndexedVector& ftran,
                               const Vector& lbbasic, const Vector& ubbasic,
                               double step, double feastol, bool* block_at_lb) {
    Int pblock = -1;            // return value
    *block_at_lb = true;

    // First pass: determine maximum step size exploiting feasibility tol.
    auto update_step = [&](Int p, double pivot) {
        if (std::abs(pivot) > kPivotZeroTol) {
            // test block at lower bound
            if (xbasic[p] + step*pivot < lbbasic[p]-feastol) {
                step = (lbbasic[p]-xbasic[p]-feastol) / pivot;
                pblock = p;
                *block_at_lb = true;
            }
            // test block at upper bound
            if (xbasic[p] + step*pivot > ubbasic[p]+feastol) {
                step = (ubbasic[p]-xbasic[p]+feastol) / pivot;
                pblock = p;
                *block_at_lb = false;
            }
        }
    };
    for_each_nonzero(ftran, update_step);

    // If the step was not blocked, we are done.
    if (pblock < 0)
        return pblock;

    // Second pass: choose maximum pivot among all that block within step.
    pblock = -1;
    double max_pivot = kPivotZeroTol;
    auto update_max = [&](Int p, double pivot) {
        if (std::abs(pivot) > max_pivot) {
            // test block at lower bound
            if (step*pivot < 0.0) {
                double step_p = (lbbasic[p]-xbasic[p]) / pivot;
                if (std::abs(step_p) <= std::abs(step)) {
                    pblock = p;
                    *block_at_lb = true;
                    max_pivot = std::abs(pivot);
                }
            }
            // test block at upper bound
            if (step*pivot > 0.0) {
                double step_p = (ubbasic[p]-xbasic[p]) / pivot;
                if (std::abs(step_p) <= std::abs(step)) {
                    pblock = p;
                    *block_at_lb = false;
                    max_pivot = std::abs(pivot);
                }
            }
        }
    };
    for_each_nonzero(ftran, update_max);
    assert(pblock >= 0);
    return pblock;
}